

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O1

lzma_ret lzma_index_hash_append
                   (lzma_index_hash *index_hash,lzma_vli unpadded_size,lzma_vli uncompressed_size)

{
  lzma_vli lVar1;
  lzma_vli lVar2;
  uint32_t uVar3;
  long lVar4;
  ulong uVar5;
  lzma_ret lVar6;
  
  lVar6 = LZMA_PROG_ERROR;
  if (((-1 < (long)uncompressed_size) && (0x8000000000000007 < unpadded_size + 0x8000000000000003))
     && (index_hash->sequence == SEQ_BLOCK)) {
    hash_append(&index_hash->blocks,unpadded_size,uncompressed_size);
    lVar1 = (index_hash->blocks).blocks_size;
    lVar6 = LZMA_DATA_ERROR;
    if ((-1 < (long)lVar1) && (-1 < (long)(index_hash->blocks).uncompressed_size)) {
      lVar2 = (index_hash->blocks).index_list_size;
      uVar3 = lzma_vli_size((index_hash->blocks).count);
      lVar4 = (uVar3 + 1) + lVar2;
      if (lVar4 + 4 < 0) {
        __assert_fail("vli <= LZMA_VLI_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                      ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
      }
      uVar5 = lVar4 + 7U & 0xfffffffffffffffc;
      if (uVar5 < 0x400000001) {
        lVar6 = (lzma_ret)((long)(lVar1 + uVar5 + 0x18) >> 0x3f) & LZMA_DATA_ERROR;
      }
    }
  }
  return lVar6;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_hash_append(lzma_index_hash *index_hash, lzma_vli unpadded_size,
		lzma_vli uncompressed_size)
{
	// Validate the arguments.
	if (index_hash->sequence != SEQ_BLOCK
			|| unpadded_size < UNPADDED_SIZE_MIN
			|| unpadded_size > UNPADDED_SIZE_MAX
			|| uncompressed_size > LZMA_VLI_MAX)
		return LZMA_PROG_ERROR;

	// Update the hash.
	return_if_error(hash_append(&index_hash->blocks,
			unpadded_size, uncompressed_size));

	// Validate the properties of *info are still in allowed limits.
	if (index_hash->blocks.blocks_size > LZMA_VLI_MAX
			|| index_hash->blocks.uncompressed_size > LZMA_VLI_MAX
			|| index_size(index_hash->blocks.count,
					index_hash->blocks.index_list_size)
				> LZMA_BACKWARD_SIZE_MAX
			|| index_stream_size(index_hash->blocks.blocks_size,
					index_hash->blocks.count,
					index_hash->blocks.index_list_size)
				> LZMA_VLI_MAX)
		return LZMA_DATA_ERROR;

	return LZMA_OK;
}